

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O2

int Llb_ManFlowBwdPath2_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  
  uVar1 = *(uint *)&pObj->field_0x18 & 7;
  if (((uVar1 != 2) && (1 < uVar1 - 5)) && (iVar2 = Aig_ObjIsConst1(pObj), iVar2 == 0)) {
    __assert_fail("Aig_ObjIsNode(pObj) || Aig_ObjIsCi(pObj) || Aig_ObjIsConst1(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Flow.c"
                  ,0x227,"int Llb_ManFlowBwdPath2_rec(Aig_Man_t *, Aig_Obj_t *)");
  }
  if (pObj->TravId == p->nTravIds) {
    return 0;
  }
  pObj->TravId = p->nTravIds;
  if ((pObj->field_5).pData == (void *)0x0) {
    if ((*(ulong *)&pObj->field_0x18 & 0x10) == 0) {
      if (((uint)*(ulong *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
        return 0;
      }
      iVar2 = Llb_ManFlowBwdPath2_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
      if (iVar2 == 0) {
        iVar2 = Llb_ManFlowBwdPath2_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
        if (iVar2 == 0) {
          return 0;
        }
        pAVar3 = pObj->pFanin1;
      }
      else {
        pAVar3 = pObj->pFanin0;
      }
      (pObj->field_5).pData = (void *)((ulong)pAVar3 & 0xfffffffffffffffe);
    }
    else {
      pObj->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)0x1;
    }
  }
  else {
    if (p->pFanData == (int *)0x0) {
      __assert_fail("p->pFanData",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Flow.c"
                    ,0x25,"Aig_Obj_t *Llb_ObjGetFanoutPath(Aig_Man_t *, Aig_Obj_t *)");
    }
    iVar2 = -1;
    uVar1 = 0;
    do {
      if (*(uint *)&pObj->field_0x18 >> 6 <= uVar1) {
        return 0;
      }
      if (uVar1 == 0) {
        iVar2 = Aig_ObjFanout0Int(p,pObj->Id);
      }
      else {
        iVar2 = Aig_ObjFanoutNext(p,iVar2);
      }
      pAVar3 = Aig_ManObj(p,iVar2 >> 1);
      uVar1 = uVar1 + 1;
    } while ((Aig_Obj_t *)(pAVar3->field_5).pData != pObj);
    if ((*(uint *)&pAVar3->field_0x18 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pFanout)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Flow.c"
                    ,0x247,"int Llb_ManFlowBwdPath2_rec(Aig_Man_t *, Aig_Obj_t *)");
    }
    iVar2 = Llb_ManFlowBwdPath2_rec(p,(Aig_Obj_t *)((ulong)pAVar3->pFanin0 & 0xfffffffffffffffe));
    if (iVar2 == 0) {
      iVar2 = Llb_ManFlowBwdPath2_rec(p,(Aig_Obj_t *)((ulong)pAVar3->pFanin1 & 0xfffffffffffffffe));
      if (iVar2 == 0) {
        iVar2 = Llb_ManFlowBwdPath2_rec(p,pAVar3);
        if (iVar2 != 0) {
          (pAVar3->field_5).pData = (void *)0x0;
          return 1;
        }
        return 0;
      }
      pAVar4 = pAVar3->pFanin1;
    }
    else {
      pAVar4 = pAVar3->pFanin0;
    }
    (pAVar3->field_5).pData = (void *)((ulong)pAVar4 & 0xfffffffffffffffe);
  }
  return 1;
}

Assistant:

int Llb_ManFlowBwdPath2_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pFanout;
    assert( Aig_ObjIsNode(pObj) || Aig_ObjIsCi(pObj) || Aig_ObjIsConst1(pObj) );
    // skip visited nodes
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Aig_ObjSetTravIdCurrent(p, pObj);
    // process node without flow
    if ( !Llb_ObjGetPath(pObj) )
    {
        // start the path if we reached a terminal node
        if ( pObj->fMarkA )
            return Llb_ObjSetPath( pObj, (Aig_Obj_t *)1 );
        // explore the fanins
//        Abc_ObjForEachFanin( pObj, pFanin, i )
//            if ( Abc_NtkMaxFlowBwdPath2_rec(pFanin) )
//                return Abc_ObjSetPath( pObj, pFanin );
        if ( Aig_ObjIsNode(pObj) )
        {
            if ( Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin0(pObj) ) )
                return Llb_ObjSetPath( pObj, Aig_ObjFanin0(pObj) );
            if ( Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin1(pObj) ) )
                return Llb_ObjSetPath( pObj, Aig_ObjFanin1(pObj) );
        }
        return 0;
    }
    // pObj has flow - find the fanout with flow
    pFanout = Llb_ObjGetFanoutPath( p, pObj );
    if ( pFanout == NULL )
        return 0;
    // go through the fanins of the fanout with flow
//    Abc_ObjForEachFanin( pFanout, pFanin, i )
//        if ( Abc_NtkMaxFlowBwdPath2_rec( pFanin ) )
//            return Abc_ObjSetPath( pFanout, pFanin );
    assert( Aig_ObjIsNode(pFanout) );
    if ( Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin0(pFanout) ) )
        return Llb_ObjSetPath( pFanout, Aig_ObjFanin0(pFanout) );
    if ( Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin1(pFanout) ) )
        return Llb_ObjSetPath( pFanout, Aig_ObjFanin1(pFanout) );
    // try the fanout
    if ( Llb_ManFlowBwdPath2_rec( p, pFanout ) )
        return Llb_ObjSetPath( pFanout, NULL );
    return 0;
}